

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::AtQuantifier
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  byte *pbVar1;
  byte bVar2;
  code *pcVar3;
  int iVar4;
  CharCount n;
  bool bVar5;
  EncodedChar EVar6;
  undefined4 *puVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar5) goto LAB_00ee986e;
    *puVar7 = 0;
  }
  bVar2 = *this->next;
  if (bVar2 - 0x2a < 2) {
    return true;
  }
  if (bVar2 == 0x3f) {
    return true;
  }
  if (bVar2 == 0x7b) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar9 = 1;
    do {
      uVar10 = uVar9;
      iVar4 = (int)uVar10;
      uVar9 = (ulong)(iVar4 + 1);
      if (this->inputLim < this->next + uVar9) break;
      if (this->inputLim < this->next + uVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ee986e;
        *puVar7 = 0;
      }
    } while ((ASCIIChars::classes[this->next[uVar10]] & 0x10) != 0);
    if (iVar4 != 1) {
      if (this->next + uVar9 <= this->inputLim) {
        if (this->inputLim < this->next + uVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) {
LAB_00ee986e:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar7 = 0;
        }
        EVar6 = this->next[uVar10];
        if (EVar6 == '}') {
          return true;
        }
        if (EVar6 == ',') {
          if ((this->next + (iVar4 + 2) <= this->inputLim) &&
             (EVar6 = ECLookahead(this,iVar4 + 1U), EVar6 == '}')) {
            return true;
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          uVar9 = (ulong)(iVar4 + 1U);
          iVar4 = 0;
          do {
            iVar8 = iVar4;
            n = (CharCount)uVar9;
            uVar10 = (ulong)(n + 1);
            if (this->inputLim < this->next + uVar10) break;
            if (this->inputLim < this->next + uVar9) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
              if (!bVar5) goto LAB_00ee986e;
              *puVar7 = 0;
            }
            pbVar1 = this->next + uVar9;
            uVar9 = uVar10;
            iVar4 = iVar8 + -1;
          } while ((ASCIIChars::classes[*pbVar1] & 0x10) != 0);
          if ((iVar8 != 0) && (this->next + uVar10 <= this->inputLim)) {
            EVar6 = ECLookahead(this,n);
            return EVar6 == '}';
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Parser<P, IsLiteral>::AtQuantifier()
    {
        // Could be terminating 0
        switch (ECLookahead())
        {
        case '*':
        case '+':
        case '?':
            return true;
        case '{':
            {
                CharCount lookahead = 1;
                while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                    lookahead++;
                if (lookahead == 1 || !ECCanConsume(lookahead + 1))
                    return false;
                switch (ECLookahead(lookahead))
                {
                case ',':
                    lookahead++;
                    if (ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}')
                        return true;
                    else
                    {
                        CharCount saved = lookahead;
                        while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                            lookahead++;
                        if (lookahead == saved)
                            return false;
                        return ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}';
                    }
                case '}':
                    return true;
                default:
                    return false;
                }
            }
        default:
            return false;
        }
    }